

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O1

bool imageHasNarrowOutlines(QImage *im)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QRgb QVar4;
  int iVar5;
  int iVar6;
  uint x;
  uint y;
  int local_34;
  
  bVar1 = QImage::isNull(im);
  if (((bVar1) || (iVar2 = QImage::width(im), iVar2 < 1)) || (iVar2 = QImage::height(im), iVar2 < 1)
     ) {
    return false;
  }
  iVar2 = QImage::width(im);
  if (iVar2 == 1) {
    return true;
  }
  iVar2 = QImage::height(im);
  if (iVar2 == 1) {
    return true;
  }
  iVar2 = QImage::height(im);
  iVar3 = QImage::width(im);
  x = 0;
  if (0 < iVar3) {
    iVar3 = 999;
    bVar1 = false;
    iVar6 = 0;
    do {
      QVar4 = QImage::pixel(im,x,(iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1);
      if ((int)QVar4 < 0) {
        iVar6 = iVar6 + 1;
        bVar1 = true;
      }
      else if (bVar1) {
        if (iVar6 <= iVar3) {
          iVar3 = iVar6;
        }
        iVar6 = 0;
        bVar1 = false;
      }
      x = x + 1;
      iVar5 = QImage::width(im);
    } while ((int)x < iVar5);
    x = (uint)(iVar3 == 1);
  }
  iVar2 = QImage::width(im);
  iVar3 = QImage::height(im);
  y = 0;
  if (0 < iVar3) {
    local_34 = 999;
    bVar1 = false;
    iVar3 = 0;
    do {
      QVar4 = QImage::pixel(im,(iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1,y);
      if ((int)QVar4 < 0) {
        iVar3 = iVar3 + 1;
        bVar1 = true;
      }
      else if (bVar1) {
        if (iVar3 <= local_34) {
          local_34 = iVar3;
        }
        iVar3 = 0;
        bVar1 = false;
      }
      y = y + 1;
      iVar6 = QImage::height(im);
    } while ((int)y < iVar6);
    y = (uint)(local_34 == 1);
  }
  return (bool)((byte)x | (byte)y);
}

Assistant:

static bool imageHasNarrowOutlines(const QImage &im)
{
    if (im.isNull() || im.width() < 1 || im.height() < 1)
        return false;
    else if (im.width() == 1 || im.height() == 1)
        return true;

    int minHThick = 999;
    int minVThick = 999;

    int thick = 0;
    bool in = false;
    int y = (im.height() + 1) / 2;
    for (int x = 0; x < im.width(); ++x) {
        int a = qAlpha(im.pixel(x, y));
        if (a > 127) {
            in = true;
            ++thick;
        } else if (in) {
            in = false;
            minHThick = qMin(minHThick, thick);
            thick = 0;
        }
    }

    thick = 0;
    in = false;
    int x = (im.width() + 1) / 2;
    for (int y = 0; y < im.height(); ++y) {
        int a = qAlpha(im.pixel(x, y));
        if (a > 127) {
            in = true;
            ++thick;
        } else if (in) {
            in = false;
            minVThick = qMin(minVThick, thick);
            thick = 0;
        }
    }

    return minHThick == 1 || minVThick == 1;
}